

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::OpenPopupEx(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ImGuiPopupData *pIVar3;
  uint in_ESI;
  ImGuiID in_EDI;
  ImVec2 IVar4;
  undefined8 extraout_XMM0_Qb;
  ImGuiPopupData popup_ref;
  int current_stack_size;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar5;
  ImGuiPopupData *in_stack_ffffffffffffffa0;
  ImVector<ImGuiPopupData> *this;
  undefined8 in_stack_ffffffffffffffa8;
  ImGuiID in_stack_ffffffffffffffb0;
  ImGuiID IVar6;
  undefined1 restore_focus_to_window_under_popup;
  int in_stack_ffffffffffffffb4;
  ImVector<ImGuiPopupData> local_30;
  int local_1c;
  ImGuiWindow *local_18;
  ImGuiContext *local_10;
  ImGuiID local_4;
  
  local_10 = GImGui;
  local_18 = GImGui->CurrentWindow;
  local_1c = (GImGui->BeginPopupStack).Size;
  local_4 = in_EDI;
  if (((in_ESI & 0x20) == 0) ||
     (bVar2 = IsPopupOpen(in_stack_ffffffffffffffb0,
                          (ImGuiPopupFlags)((ulong)in_stack_ffffffffffffffa8 >> 0x20)), !bVar2)) {
    ImGuiPopupData::ImGuiPopupData(in_stack_ffffffffffffffa0);
    iVar5 = local_10->FrameCount;
    IVar6 = local_4;
    ImVector<unsigned_int>::back(&local_18->IDStack);
    restore_focus_to_window_under_popup = (undefined1)(IVar6 >> 0x18);
    IVar4 = NavCalcPreferredRefPos();
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_4_ = IVar4.x;
    auVar1._4_4_ = IVar4.y;
    local_30._0_8_ = vmovlpd_avx(auVar1);
    bVar2 = IsMousePosValid(&(local_10->IO).MousePos);
    if (bVar2) {
      this = (ImVector<ImGuiPopupData> *)&(local_10->IO).MousePos;
    }
    else {
      this = &local_30;
    }
    local_30.Data = *(ImGuiPopupData **)this;
    if ((local_10->OpenPopupStack).Size < local_1c + 1) {
      ImVector<ImGuiPopupData>::push_back
                (this,(ImGuiPopupData *)
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    else {
      pIVar3 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_1c);
      if ((pIVar3->PopupId == local_4) &&
         (pIVar3 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_1c),
         pIVar3->OpenFrameCount == local_10->FrameCount + -1)) {
        pIVar3 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_1c);
        pIVar3->OpenFrameCount = iVar5;
      }
      else {
        ClosePopupToLevel(in_stack_ffffffffffffffb4,(bool)restore_focus_to_window_under_popup);
        ImVector<ImGuiPopupData>::push_back
                  (this,(ImGuiPopupData *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      }
    }
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    const int current_stack_size = g.BeginPopupStack.Size;

    if (popup_flags & ImGuiPopupFlags_NoOpenOverExistingPopup)
        if (IsPopupOpen(0u, ImGuiPopupFlags_AnyPopupId))
            return;

    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    IMGUI_DEBUG_LOG_POPUP("OpenPopupEx(0x%08X)\n", id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            ClosePopupToLevel(current_stack_size, false);
            g.OpenPopupStack.push_back(popup_ref);
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}